

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_simplifier.cc
# Opt level: O0

bool __thiscall S2PolylineSimplifier::Extend(S2PolylineSimplifier *this,S2Point *dst)

{
  bool bVar1;
  S1ChordAngle y;
  double p;
  S1ChordAngle local_28;
  S2Point *local_20;
  S2Point *dst_local;
  S2PolylineSimplifier *this_local;
  
  local_20 = dst;
  dst_local = &this->src_;
  S1ChordAngle::S1ChordAngle(&local_28,&this->src_,dst);
  y = S1ChordAngle::Right();
  bVar1 = operator>(local_28,y);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    p = GetAngle(this,local_20);
    this_local._7_1_ = S1Interval::Contains(&this->window_,p);
  }
  return this_local._7_1_;
}

Assistant:

bool S2PolylineSimplifier::Extend(const S2Point& dst) const {
  // We limit the maximum edge length to 90 degrees in order to simplify the
  // error bounds.  (The error gets arbitrarily large as the edge length
  // approaches 180 degrees.)
  if (S1ChordAngle(src_, dst) > S1ChordAngle::Right()) return false;

  // Otherwise check whether this vertex is in the acceptable angle range.
  return window_.Contains(GetAngle(dst));
}